

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86_64-gen.c
# Opt level: O1

int oad(int c,int s)

{
  bool bVar1;
  int iVar2;
  
  iVar2 = s;
  if (nocode_wanted == 0) {
    if (c != 0) {
      do {
        g(c);
        bVar1 = 0xff < (uint)c;
        c = (uint)c >> 8;
      } while (bVar1);
    }
    iVar2 = ind;
    gen_le32(s);
  }
  return iVar2;
}

Assistant:

static int oad(int c, int s) {
  int t;
  if (nocode_wanted)
    return s;
  o(c);
  t = ind;
  gen_le32(s);
  return t;
}